

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::DeepTiledInputFile::readPixelSampleCounts
          (DeepTiledInputFile *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly)

{
  IStream *pIVar1;
  Compressor *pCVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  Int64 *pIVar7;
  Data *pDVar8;
  int *piVar9;
  ostream *poVar10;
  ArgExc *pAVar11;
  InputExc *pIVar12;
  ulong uVar13;
  int iVar14;
  char *pcVar15;
  int y;
  undefined4 in_register_0000008c;
  int iVar16;
  int iVar17;
  undefined8 uVar18;
  char *readPtr;
  undefined8 local_230;
  char *local_228;
  ulong local_220;
  int local_214;
  ulong local_210;
  undefined8 local_208;
  char *local_200;
  int local_1f4;
  uint local_1f0;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int accumulatedCount;
  Box2i tileRange;
  Lock local_1c8;
  stringstream _iex_throw_s;
  ostream local_1a8 [376];
  undefined8 uVar6;
  
  local_230 = CONCAT44(in_register_0000008c,lx);
  local_1c8._mutex = &this->_data->_streamData->super_Mutex;
  std::mutex::lock(local_1c8._mutex);
  local_1c8._locked = true;
  local_228 = (char *)0x0;
  iVar4 = (*this->_data->_streamData->is->_vptr_IStream[5])();
  uVar6 = CONCAT44(extraout_var,iVar4);
  bVar3 = isValidLevel(this,(int)local_230,ly);
  local_208 = uVar6;
  if (!bVar3) {
    local_228 = (char *)uVar6;
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    poVar10 = std::operator<<(local_1a8,"Level coordinate (");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)local_230);
    poVar10 = std::operator<<(poVar10,", ");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,ly);
    std::operator<<(poVar10,") is invalid.");
    pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar11,(stringstream *)&_iex_throw_s);
    __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  local_1e8 = dx2;
  if (dx2 < dx1) {
    local_1e8 = dx1;
  }
  if (dx1 < dx2) {
    dx2 = dx1;
  }
  uVar5 = dy2;
  if (dy2 < dy1) {
    uVar5 = dy1;
  }
  uVar13 = (ulong)(uint)dy2;
  if (dy1 < dy2) {
    uVar13 = (ulong)(uint)dy1;
  }
  pDVar8 = this->_data;
  bVar3 = pDVar8->lineOrder != DECREASING_Y;
  local_1ec = (int)uVar13 + -1;
  if (bVar3) {
    local_1ec = uVar5 + 1;
  }
  local_1f4 = (bVar3 - 1) + (uint)bVar3;
  uVar18 = local_230;
  local_1f0 = dx2;
  if (!bVar3) {
    uVar13 = (ulong)uVar5;
  }
  do {
    uVar5 = local_1f0;
    if ((int)uVar13 == local_1ec) {
      pIVar1 = pDVar8->_streamData->is;
      (*pIVar1->_vptr_IStream[6])(pIVar1,uVar6);
      IlmThread_2_5::Lock::~Lock(&local_1c8);
      return;
    }
    while( true ) {
      local_220 = uVar13;
      iVar4 = (int)local_220;
      if (local_1e8 < (int)uVar5) break;
      iVar14 = (int)uVar18;
      bVar3 = isValidTile(this,uVar5,iVar4,iVar14,ly);
      if (!bVar3) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar10 = std::operator<<(local_1a8,"Tile (");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,uVar5);
        poVar10 = std::operator<<(poVar10,", ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)local_220);
        poVar10 = std::operator<<(poVar10,", ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)local_230);
        poVar10 = std::operator<<(poVar10,",");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,ly);
        std::operator<<(poVar10,") is not a valid tile.");
        pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar11,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      Imf_2_5::dataWindowForTile
                ((Imf_2_5 *)&tileRange,&pDVar8->tileDesc,pDVar8->minX,pDVar8->maxX,pDVar8->minY,
                 pDVar8->maxY,uVar5,iVar4,iVar14,ly);
      pDVar8 = this->_data;
      iVar16 = pDVar8->sampleCountXTileCoords;
      local_1e0 = tileRange.min.y * pDVar8->sampleCountYTileCoords;
      local_1e4 = tileRange.min.x;
      pIVar1 = pDVar8->_streamData->is;
      local_210 = (ulong)uVar5;
      pIVar7 = TileOffsets::operator()(&pDVar8->tileOffsets,uVar5,iVar4,iVar14,ly);
      (*pIVar1->_vptr_IStream[6])(pIVar1,*pIVar7);
      pDVar8 = this->_data;
      if ((pDVar8->version & 0x1000) != 0) {
        pIVar1 = pDVar8->_streamData->is;
        (*pIVar1->_vptr_IStream[3])(pIVar1,&readPtr,4);
        pDVar8 = this->_data;
        if ((int)readPtr != pDVar8->partNumber) {
          pIVar12 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::InputExc::InputExc(pIVar12,"Unexpected part number.");
          __cxa_throw(pIVar12,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
        }
      }
      pIVar1 = pDVar8->_streamData->is;
      (*pIVar1->_vptr_IStream[3])(pIVar1,&readPtr,4);
      local_228 = (char *)CONCAT44(local_228._4_4_,(int)readPtr);
      pIVar1 = this->_data->_streamData->is;
      (*pIVar1->_vptr_IStream[3])(pIVar1,&readPtr,4);
      local_214 = (int)readPtr;
      pIVar1 = this->_data->_streamData->is;
      (*pIVar1->_vptr_IStream[3])(pIVar1,&readPtr,4);
      iVar4 = (int)readPtr;
      pIVar1 = this->_data->_streamData->is;
      (*pIVar1->_vptr_IStream[3])(pIVar1,&readPtr,4);
      if ((int)local_228 != (int)local_210) {
        pcVar15 = "Unexpected tile x coordinate.";
LAB_00151a4b:
        pIVar12 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::InputExc::InputExc(pIVar12,pcVar15);
        __cxa_throw(pIVar12,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
      }
      if (local_214 != (int)local_220) {
        pcVar15 = "Unexpected tile y coordinate.";
        goto LAB_00151a4b;
      }
      if (iVar4 != (int)local_230) {
        pcVar15 = "Unexpected tile x level number coordinate.";
        goto LAB_00151a4b;
      }
      if ((int)readPtr != ly) {
        pcVar15 = "Unexpected tile y level number coordinate.";
        goto LAB_00151a4b;
      }
      pIVar1 = this->_data->_streamData->is;
      (*pIVar1->_vptr_IStream[3])(pIVar1,&readPtr,8);
      pcVar15 = readPtr;
      pIVar1 = this->_data->_streamData->is;
      (*pIVar1->_vptr_IStream[3])(pIVar1,&readPtr,8);
      local_228 = readPtr;
      pIVar1 = this->_data->_streamData->is;
      (*pIVar1->_vptr_IStream[3])(pIVar1,&readPtr,8);
      pDVar8 = this->_data;
      if ((char *)pDVar8->maxSampleCountTableSize < pcVar15) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar10 = std::operator<<(local_1a8,"Bad sampleCountTableDataSize read from tile ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)local_210);
        poVar10 = std::operator<<(poVar10,',');
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)local_220);
        poVar10 = std::operator<<(poVar10,',');
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)local_230);
        poVar10 = std::operator<<(poVar10,',');
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,ly);
        poVar10 = std::operator<<(poVar10,": expected ");
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        poVar10 = std::operator<<(poVar10," or less, got ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar11,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      local_200 = readPtr;
      if ((((char *)0x7fffffff < local_228) || ((char *)0x7fffffff < readPtr)) ||
         ((ulong)pcVar15 >> 0x1f != 0)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar10 = std::operator<<(local_1a8,"This version of the library does not");
        poVar10 = std::operator<<(poVar10,"support the allocation of data with size  > ");
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        poVar10 = std::operator<<(poVar10," file table size    :");
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        poVar10 = std::operator<<(poVar10," file unpacked size :");
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        poVar10 = std::operator<<(poVar10," file packed size   :");
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        std::operator<<(poVar10,".\n");
        pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar11,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      pIVar1 = pDVar8->_streamData->is;
      (*pIVar1->_vptr_IStream[3])
                (pIVar1,(pDVar8->sampleCountTableBuffer)._data,(ulong)pcVar15 & 0xffffffff);
      pDVar8 = this->_data;
      if (pcVar15 < (char *)pDVar8->maxSampleCountTableSize) {
        pCVar2 = pDVar8->sampleCountTableComp;
        if (pCVar2 == (Compressor *)0x0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
          poVar10 = std::operator<<(local_1a8,"Deep scanline data corrupt at tile ");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)local_210);
          poVar10 = std::operator<<(poVar10,',');
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)local_220);
          poVar10 = std::operator<<(poVar10,',');
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)local_230);
          poVar10 = std::operator<<(poVar10,',');
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,ly);
          std::operator<<(poVar10," (sampleCountTableDataSize error)");
          pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar11,(stringstream *)&_iex_throw_s);
          __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
        }
        (*pCVar2->_vptr_Compressor[6])
                  (pCVar2,(pDVar8->sampleCountTableBuffer)._data,(ulong)pcVar15 & 0xffffffff,
                   (ulong)(uint)tileRange.min.y,&readPtr);
      }
      else {
        readPtr = (pDVar8->sampleCountTableBuffer)._data;
      }
      iVar16 = iVar16 * local_1e4;
      pcVar15 = (char *)0x0;
      iVar4 = tileRange.min.y;
      while (iVar4 <= tileRange.max.y) {
        y = iVar4 - local_1e0;
        uVar13 = 0;
        iVar14 = tileRange.min.x;
        local_228 = pcVar15;
        local_214 = iVar4;
        while( true ) {
          if (tileRange.max.x < iVar14) break;
          Xdr::read<Imf_2_5::CharPtrIO,char_const*>(&readPtr,&accumulatedCount);
          iVar4 = accumulatedCount;
          iVar17 = accumulatedCount - (int)uVar13;
          if (accumulatedCount < (int)uVar13) {
            iex_debugTrap();
            std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
            poVar10 = std::operator<<(local_1a8,"Deep tile sampleCount data corrupt at tile ");
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)local_210);
            poVar10 = std::operator<<(poVar10,',');
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)local_220);
            poVar10 = std::operator<<(poVar10,',');
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)local_230);
            poVar10 = std::operator<<(poVar10,',');
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,ly);
            std::operator<<(poVar10," (negative sample count detected)");
            pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_2_5::ArgExc::ArgExc(pAVar11,(stringstream *)&_iex_throw_s);
            __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
          }
          piVar9 = Data::getSampleCount(this->_data,iVar14 - iVar16,y);
          *piVar9 = iVar17;
          iVar14 = iVar14 + 1;
          uVar13 = (ulong)(uint)iVar4;
          uVar6 = local_208;
        }
        pcVar15 = local_228 + uVar13;
        iVar4 = local_214 + 1;
      }
      pDVar8 = this->_data;
      pcVar15 = (char *)((long)pDVar8->combinedSampleSize * (long)pcVar15);
      if (local_200 <= pcVar15 && (long)pcVar15 - (long)local_200 != 0) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar10 = std::operator<<(local_1a8,"Deep scanline sampleCount data corrupt at tile ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)local_210);
        poVar10 = std::operator<<(poVar10,',');
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)local_220);
        poVar10 = std::operator<<(poVar10,',');
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)local_230);
        poVar10 = std::operator<<(poVar10,',');
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,ly);
        poVar10 = std::operator<<(poVar10,": pixel data only contains ");
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        poVar10 = std::operator<<(poVar10," bytes of data but table references at least ");
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        std::operator<<(poVar10," bytes of sample data");
        pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar11,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      uVar18 = local_230;
      uVar5 = (int)local_210 + 1;
      uVar13 = local_220;
    }
    uVar13 = (ulong)(uint)(iVar4 + local_1f4);
  } while( true );
}

Assistant:

void
DeepTiledInputFile::readPixelSampleCounts (int dx1, int dx2,
                                           int dy1, int dy2,
                                           int lx,  int ly)
{
    Int64 savedFilePos = 0;

    try
    {
        Lock lock (*_data->_streamData);

        savedFilePos = _data->_streamData->is->tellg();

        
        if (!isValidLevel (lx, ly))
        {
            THROW (IEX_NAMESPACE::ArgExc,
                   "Level coordinate "
                   "(" << lx << ", " << ly << ") "
                   "is invalid.");
        }
        
        if (dx1 > dx2)
            std::swap (dx1, dx2);

        if (dy1 > dy2)
            std::swap (dy1, dy2);

        int dyStart = dy1;
        int dyStop  = dy2 + 1;
        int dY      = 1;

        if (_data->lineOrder == DECREASING_Y)
        {
            dyStart = dy2;
            dyStop  = dy1 - 1;
            dY      = -1;
        }

        // (TODO) Check if we have read the sample counts for those tiles,
        // if we have, no need to read again.
        for (int dy = dyStart; dy != dyStop; dy += dY)
        {
            for (int dx = dx1; dx <= dx2; dx++)
            {
                
                if (!isValidTile (dx, dy, lx, ly))
                {
                    THROW (IEX_NAMESPACE::ArgExc,
                           "Tile (" << dx << ", " << dy << ", " <<
                           lx << "," << ly << ") is not a valid tile.");
                }
                
                Box2i tileRange = OPENEXR_IMF_INTERNAL_NAMESPACE::dataWindowForTile (
                        _data->tileDesc,
                        _data->minX, _data->maxX,
                        _data->minY, _data->maxY,
                        dx, dy, lx, ly);

                int xOffset = _data->sampleCountXTileCoords * tileRange.min.x;
                int yOffset = _data->sampleCountYTileCoords * tileRange.min.y;

                //
                // Skip and check the tile coordinates.
                //

                _data->_streamData->is->seekg(_data->tileOffsets(dx, dy, lx, ly));

                if (isMultiPart(_data->version))
                {
                    int partNumber;
                    Xdr::read <StreamIO> (*_data->_streamData->is, partNumber);

                    if (partNumber != _data->partNumber)
                        throw IEX_NAMESPACE::InputExc ("Unexpected part number.");
                }

                int xInFile, yInFile, lxInFile, lyInFile;
                Xdr::read <StreamIO> (*_data->_streamData->is, xInFile);
                Xdr::read <StreamIO> (*_data->_streamData->is, yInFile);
                Xdr::read <StreamIO> (*_data->_streamData->is, lxInFile);
                Xdr::read <StreamIO> (*_data->_streamData->is, lyInFile);

                if (xInFile != dx)
                    throw IEX_NAMESPACE::InputExc ("Unexpected tile x coordinate.");

                if (yInFile != dy)
                    throw IEX_NAMESPACE::InputExc ("Unexpected tile y coordinate.");

                if (lxInFile != lx)
                    throw IEX_NAMESPACE::InputExc ("Unexpected tile x level number coordinate.");

                if (lyInFile != ly)
                    throw IEX_NAMESPACE::InputExc ("Unexpected tile y level number coordinate.");

                Int64 tableSize, dataSize, unpackedDataSize;
                Xdr::read <StreamIO> (*_data->_streamData->is, tableSize);
                Xdr::read <StreamIO> (*_data->_streamData->is, dataSize);
                Xdr::read <StreamIO> (*_data->_streamData->is, unpackedDataSize);

                
                if(tableSize>_data->maxSampleCountTableSize)
                {
                    THROW (IEX_NAMESPACE::ArgExc, "Bad sampleCountTableDataSize read from tile "<< dx << ',' << dy << ',' << lx << ',' << ly << ": expected " << _data->maxSampleCountTableSize << " or less, got "<< tableSize);
                }
                    
                
                //
                // We make a check on the data size requirements here.
                // Whilst we wish to store 64bit sizes on disk, not all the compressors
                // have been made to work with such data sizes and are still limited to
                // using signed 32 bit (int) for the data size. As such, this version
                // insists that we validate that the data size does not exceed the data
                // type max limit.
                // @TODO refactor the compressor code to ensure full 64-bit support.
                //

                Int64 compressorMaxDataSize = static_cast<Int64>(std::numeric_limits<int>::max());
                if (dataSize         > compressorMaxDataSize ||
                    unpackedDataSize > compressorMaxDataSize ||
                    tableSize        > compressorMaxDataSize)
                {
                    THROW (IEX_NAMESPACE::ArgExc, "This version of the library does not"
                          << "support the allocation of data with size  > "
                          << compressorMaxDataSize
                          << " file table size    :" << tableSize
                          << " file unpacked size :" << unpackedDataSize
                          << " file packed size   :" << dataSize << ".\n");
                }

                //
                // Read and uncompress the pixel sample count table.
                //

                _data->_streamData->is->read(_data->sampleCountTableBuffer, tableSize);

                const char* readPtr;

                if (tableSize < _data->maxSampleCountTableSize)
                {
                    if(!_data->sampleCountTableComp)
                    {
                        THROW(IEX_NAMESPACE::ArgExc,"Deep scanline data corrupt at tile " << dx << ',' << dy << ',' << lx << ',' <<  ly << " (sampleCountTableDataSize error)");
                    }
                    _data->sampleCountTableComp->uncompress(_data->sampleCountTableBuffer,
                                                            tableSize,
                                                            tileRange.min.y,
                                                            readPtr);
                }
                else
                    readPtr = _data->sampleCountTableBuffer;

                size_t cumulative_total_samples =0;
                int lastAccumulatedCount;
                for (int j = tileRange.min.y; j <= tileRange.max.y; j++)
                {
                    lastAccumulatedCount = 0;
                    for (int i = tileRange.min.x; i <= tileRange.max.x; i++)
                    {
                        int accumulatedCount;
                        Xdr::read <CharPtrIO> (readPtr, accumulatedCount);
                        
                        if (accumulatedCount < lastAccumulatedCount)
                        {
                            THROW(IEX_NAMESPACE::ArgExc,"Deep tile sampleCount data corrupt at tile " 
                                  << dx << ',' << dy << ',' << lx << ',' <<  ly << " (negative sample count detected)");
                        }

                        int count = accumulatedCount - lastAccumulatedCount;
                        lastAccumulatedCount = accumulatedCount;
                        
                        _data->getSampleCount(i - xOffset, j - yOffset) =count;
                    }
                    cumulative_total_samples += lastAccumulatedCount;
                }
                
                if(cumulative_total_samples * _data->combinedSampleSize > unpackedDataSize)
                {
                    THROW(IEX_NAMESPACE::ArgExc,"Deep scanline sampleCount data corrupt at tile " 
                                                << dx << ',' << dy << ',' << lx << ',' <<  ly 
                                                << ": pixel data only contains " << unpackedDataSize 
                                                << " bytes of data but table references at least " 
                                                << cumulative_total_samples*_data->combinedSampleSize << " bytes of sample data" );            
                }
                    
            }
        }

        _data->_streamData->is->seekg(savedFilePos);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        REPLACE_EXC (e, "Error reading sample count data from image "
                     "file \"" << fileName() << "\". " << e.what());

         _data->_streamData->is->seekg(savedFilePos);

        throw;
    }
}